

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.h
# Opt level: O3

ThisType * Gs::Matrix<std::complex<float>,_4UL,_4UL>::Identity(void)

{
  complex<float> *pcVar1;
  undefined1 auVar2 [16];
  complex<float> *pcVar3;
  size_t c;
  long lVar4;
  complex<float> *pcVar5;
  long lVar6;
  ThisType *result;
  complex<float> *in_RDI;
  int iVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  long lVar10;
  
  pcVar3 = in_RDI;
  in_RDI[0xe] = 0;
  in_RDI[0xf] = 0;
  in_RDI[0xc] = 0;
  in_RDI[0xd] = 0;
  in_RDI[10]._M_value = 0;
  in_RDI[0xb]._M_value = 0;
  in_RDI[8]._M_value = 0;
  in_RDI[9]._M_value = 0;
  in_RDI[6]._M_value = 0;
  in_RDI[7]._M_value = 0;
  in_RDI[4]._M_value = 0;
  in_RDI[5]._M_value = 0;
  in_RDI[2]._M_value = 0;
  in_RDI[3]._M_value = 0;
  in_RDI->_M_value = 0;
  in_RDI[1]._M_value = 0;
  auVar9 = _DAT_0010d0a0;
  lVar4 = 0;
  pcVar5 = in_RDI;
  do {
    iVar7 = (int)((ulong)lVar4 >> 0x20);
    lVar6 = 0;
    auVar8 = auVar9;
    do {
      lVar10 = auVar8._8_8_;
      pcVar1 = pcVar5 + lVar6;
      *(uint *)&pcVar1->_M_value =
           -(uint)(auVar8._0_4_ == (int)lVar4 && auVar8._4_4_ == iVar7) & 0x3f800000;
      *(undefined4 *)((long)&pcVar1->_M_value + 4) = 0;
      *(uint *)&pcVar1[1]._M_value =
           -(uint)(auVar8._8_4_ == (int)lVar4 && auVar8._12_4_ == iVar7) & 0x3f800000;
      *(undefined4 *)((long)&pcVar1[1]._M_value + 4) = 0;
      auVar2 = _DAT_0010d0a0;
      lVar6 = lVar6 + 2;
      auVar8._0_8_ = auVar8._0_8_ + 2;
      auVar8._8_8_ = lVar10 + 2;
    } while (lVar6 != 4);
    lVar4 = lVar4 + 1;
    pcVar5 = pcVar5 + 4;
  } while (lVar4 != 4);
  lVar4 = 0;
  do {
    iVar7 = (int)((ulong)lVar4 >> 0x20);
    lVar6 = 0;
    auVar9 = auVar2;
    do {
      lVar10 = auVar9._8_8_;
      pcVar5 = in_RDI + lVar6;
      *(uint *)&pcVar5->_M_value =
           -(uint)(auVar9._0_4_ == (int)lVar4 && auVar9._4_4_ == iVar7) & 0x3f800000;
      *(undefined4 *)((long)&pcVar5->_M_value + 4) = 0;
      *(uint *)&pcVar5[1]._M_value =
           -(uint)(auVar9._8_4_ == (int)lVar4 && auVar9._12_4_ == iVar7) & 0x3f800000;
      *(undefined4 *)((long)&pcVar5[1]._M_value + 4) = 0;
      lVar6 = lVar6 + 2;
      auVar9._0_8_ = auVar9._0_8_ + 2;
      auVar9._8_8_ = lVar10 + 2;
    } while (lVar6 != 4);
    lVar4 = lVar4 + 1;
    in_RDI = in_RDI + 4;
  } while (lVar4 != 4);
  return (ThisType *)pcVar3;
}

Assistant:

static ThisType Identity()
        {
            ThisType result;
            result.LoadIdentity();
            return result;
        }